

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglxconvenience.cpp
# Opt level: O1

QList<int> *
qglx_buildSpec(QList<int> *__return_storage_ptr__,QSurfaceFormat *format,int drawableBit,int flags)

{
  bool bVar1;
  int iVar2;
  SwapBehavior SVar3;
  QColorSpace *this;
  long in_FS_OFFSET;
  QColorSpace local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (int *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_48.d_ptr.d.ptr._0_4_ = 3;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
             (int *)&local_48);
  QList<int>::end(__return_storage_ptr__);
  local_48.d_ptr.d.ptr._0_4_ = 0;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
             (int *)&local_48);
  QList<int>::end(__return_storage_ptr__);
  local_48.d_ptr.d.ptr._0_4_ = 0x8011;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
             (int *)&local_48);
  QList<int>::end(__return_storage_ptr__);
  local_48.d_ptr.d.ptr._0_4_ = 1;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
             (int *)&local_48);
  QList<int>::end(__return_storage_ptr__);
  local_48.d_ptr.d.ptr._0_4_ = 8;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
             (int *)&local_48);
  QList<int>::end(__return_storage_ptr__);
  local_48.d_ptr.d.ptr._0_4_ = QSurfaceFormat::redBufferSize(format);
  if ((int)local_48.d_ptr.d.ptr < 2) {
    local_48.d_ptr.d.ptr._0_4_ = 1;
  }
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
             (int *)&local_48);
  QList<int>::end(__return_storage_ptr__);
  local_48.d_ptr.d.ptr._0_4_ = 9;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
             (int *)&local_48);
  QList<int>::end(__return_storage_ptr__);
  local_48.d_ptr.d.ptr._0_4_ = QSurfaceFormat::greenBufferSize(format);
  if ((int)local_48.d_ptr.d.ptr < 2) {
    local_48.d_ptr.d.ptr._0_4_ = 1;
  }
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
             (int *)&local_48);
  QList<int>::end(__return_storage_ptr__);
  local_48.d_ptr.d.ptr._0_4_ = 10;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
             (int *)&local_48);
  QList<int>::end(__return_storage_ptr__);
  iVar2 = QSurfaceFormat::blueBufferSize(format);
  local_48.d_ptr.d.ptr._0_4_ = 1;
  if (1 < iVar2) {
    local_48.d_ptr.d.ptr._0_4_ = iVar2;
  }
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
             (int *)&local_48);
  QList<int>::end(__return_storage_ptr__);
  local_48.d_ptr.d.ptr._0_4_ = 0xb;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
             (int *)&local_48);
  QList<int>::end(__return_storage_ptr__);
  iVar2 = QSurfaceFormat::alphaBufferSize(format);
  local_48.d_ptr.d.ptr._0_4_ = 0;
  if (0 < iVar2) {
    local_48.d_ptr.d.ptr._0_4_ = iVar2;
  }
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
             (int *)&local_48);
  QList<int>::end(__return_storage_ptr__);
  SVar3 = QSurfaceFormat::swapBehavior(format);
  if (SVar3 != SingleBuffer) {
    local_48.d_ptr.d.ptr._0_4_ = 5;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (int *)&local_48);
    QList<int>::end(__return_storage_ptr__);
    local_48.d_ptr.d.ptr._0_4_ = 1;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (int *)&local_48);
    QList<int>::end(__return_storage_ptr__);
  }
  bVar1 = QSurfaceFormat::testOption(format,StereoBuffers);
  if (bVar1) {
    local_48.d_ptr.d.ptr._0_4_ = 6;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (int *)&local_48);
    QList<int>::end(__return_storage_ptr__);
    local_48.d_ptr.d.ptr._0_4_ = 1;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (int *)&local_48);
    QList<int>::end(__return_storage_ptr__);
  }
  iVar2 = QSurfaceFormat::depthBufferSize(format);
  if (iVar2 != -1) {
    local_48.d_ptr.d.ptr._0_4_ = 0xc;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (int *)&local_48);
    QList<int>::end(__return_storage_ptr__);
    local_48.d_ptr.d.ptr._0_4_ = QSurfaceFormat::depthBufferSize(format);
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (int *)&local_48);
    QList<int>::end(__return_storage_ptr__);
  }
  iVar2 = QSurfaceFormat::stencilBufferSize(format);
  if (iVar2 != -1) {
    local_48.d_ptr.d.ptr._0_4_ = 0xd;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (int *)&local_48);
    QList<int>::end(__return_storage_ptr__);
    local_48.d_ptr.d.ptr._0_4_ = QSurfaceFormat::stencilBufferSize(format);
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (int *)&local_48);
    QList<int>::end(__return_storage_ptr__);
  }
  iVar2 = QSurfaceFormat::samples(format);
  if (1 < iVar2) {
    local_48.d_ptr.d.ptr._0_4_ = 100000;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (int *)&local_48);
    QList<int>::end(__return_storage_ptr__);
    local_48.d_ptr.d.ptr._0_4_ = 1;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (int *)&local_48);
    QList<int>::end(__return_storage_ptr__);
    local_48.d_ptr.d.ptr._0_4_ = 0x186a1;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (int *)&local_48);
    QList<int>::end(__return_storage_ptr__);
    local_48.d_ptr.d.ptr._0_4_ = QSurfaceFormat::samples(format);
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               (int *)&local_48);
    QList<int>::end(__return_storage_ptr__);
  }
  if ((flags & 1U) == 0) {
    bVar1 = false;
  }
  else {
    this = QSurfaceFormat::colorSpace(format);
    QColorSpace::QColorSpace(&local_48,SRgb);
    bVar1 = QColorSpace::equals(this,&local_48);
  }
  if ((flags & 1U) != 0) {
    QColorSpace::~QColorSpace(&local_48);
  }
  if (bVar1 != false) {
    local_3c = 0x20b2;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               &local_3c);
    QList<int>::end(__return_storage_ptr__);
    local_3c = 1;
    QtPrivate::QPodArrayOps<int>::emplace<int&>
              ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
               &local_3c);
    QList<int>::end(__return_storage_ptr__);
  }
  local_3c = 0x8010;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,&local_3c)
  ;
  QList<int>::end(__return_storage_ptr__);
  local_3c = drawableBit;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,&local_3c)
  ;
  QList<int>::end(__return_storage_ptr__);
  local_3c = 0;
  QtPrivate::QPodArrayOps<int>::emplace<int&>
            ((QPodArrayOps<int> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,&local_3c)
  ;
  QList<int>::end(__return_storage_ptr__);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> qglx_buildSpec(const QSurfaceFormat &format, int drawableBit, int flags)
{
    QList<int> spec;

    spec << GLX_LEVEL
         << 0

         << GLX_RENDER_TYPE
         << GLX_RGBA_BIT

         << GLX_RED_SIZE
         << qMax(1, format.redBufferSize())

         << GLX_GREEN_SIZE
         << qMax(1, format.greenBufferSize())

         << GLX_BLUE_SIZE
         << qMax(1, format.blueBufferSize())

         << GLX_ALPHA_SIZE
         << qMax(0, format.alphaBufferSize());

    if (format.swapBehavior() != QSurfaceFormat::SingleBuffer)
        spec << GLX_DOUBLEBUFFER
             << True;

    if (format.stereo())
        spec << GLX_STEREO
             << True;

    if (format.depthBufferSize() != -1)
        spec << GLX_DEPTH_SIZE
             << format.depthBufferSize();

    if (format.stencilBufferSize() != -1)
        spec << GLX_STENCIL_SIZE
             << format.stencilBufferSize();

    if (format.samples() > 1)
        spec << GLX_SAMPLE_BUFFERS_ARB
             << 1
             << GLX_SAMPLES_ARB
             << format.samples();

    if ((flags & QGLX_SUPPORTS_SRGB) && format.colorSpace() == QColorSpace::SRgb)
        spec << GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB
             << True;

    spec << GLX_DRAWABLE_TYPE
         << drawableBit

         << XNone;

    return spec;
}